

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_nonfinite<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,bool isinf,
          basic_format_specs<char32_t> specs,float_specs *fspecs)

{
  undefined4 uVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar2;
  size_t size;
  char *pcVar3;
  bool bVar4;
  anon_class_16_2_632e021f local_10;
  
  uVar1 = specs.fill._16_4_;
  if ((specs.fill.size_ == '\x01') && (specs.fill.data_[0] == L'0')) {
    specs.fill.data_[0] = L' ';
  }
  bVar4 = (*(uint *)&fspecs->field_0x4 >> 0x10 & 1) == 0;
  pcVar3 = "INF";
  if (bVar4) {
    pcVar3 = "inf";
  }
  local_10.str = "NAN";
  if (bVar4) {
    local_10.str = "nan";
  }
  if (isinf) {
    local_10.str = pcVar3;
  }
  local_10.sign = *(uint *)&fspecs->field_0x4 >> 8 & 0xff;
  size = (ulong)(local_10.sign != none) + 3;
  specs.fill._16_4_ = uVar1;
  bVar2 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_nonfinite<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,bool,fmt::v8::basic_format_specs<char32_t>,fmt::v8::detail::float_specs_const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_&>
                    (out,&specs,size,size,&local_10);
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_nonfinite(OutputIt out, bool isinf,
                                     basic_format_specs<Char> specs,
                                     const float_specs& fspecs) -> OutputIt {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  // Replace '0'-padding with space for non-finite values.
  const bool is_zero_fill =
      specs.fill.size() == 1 && *specs.fill.data() == static_cast<Char>('0');
  if (is_zero_fill) specs.fill[0] = static_cast<Char>(' ');
  return write_padded(out, specs, size, [=](reserve_iterator<OutputIt> it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    return copy_str<Char>(str, str + str_size, it);
  });
}